

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label.cpp
# Opt level: O1

string_view __thiscall jhu::thrax::SAMTLabeler::operator()(SAMTLabeler *this,SpanPair nt)

{
  pointer pCVar1;
  short sVar2;
  ushort uVar3;
  pointer pCVar4;
  char **ppcVar5;
  bool bVar6;
  _Optional_base<jhu::thrax::(anonymous_namespace)::Constituent,_true,_true> *p_Var7;
  long lVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int iVar11;
  difference_type __d_11;
  pointer pNVar12;
  __normal_iterator<const_jhu::thrax::Node_*,_std::vector<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>_>
  _Var13;
  iterator iVar14;
  difference_type __d_7;
  ulong uVar15;
  pointer pNVar16;
  difference_type __d_2;
  pointer extraout_RDX;
  pointer pNVar17;
  pointer pNVar18;
  pointer pNVar19;
  pointer pcVar20;
  pointer pNVar21;
  ulong uVar22;
  pointer pNVar23;
  pointer pNVar24;
  pointer pNVar25;
  ulong uVar26;
  ulong uVar28;
  pointer in_R9;
  difference_type __d_1;
  undefined7 uVar31;
  pointer pNVar29;
  pointer pNVar30;
  difference_type __d_5;
  uint uVar32;
  pointer unaff_R12;
  short sVar33;
  const_iterator __position;
  size_type sVar34;
  short sVar35;
  Span nt_00;
  string_view sVar36;
  optional<jhu::thrax::(anonymous_namespace)::Concat> rest;
  optional<jhu::thrax::(anonymous_namespace)::Constituent> label;
  __visit_result_t<jhu::thrax::(anonymous_namespace)::LabelVisitor,_std::variant<jhu::thrax::(anonymous_namespace)::Constituent,_jhu::thrax::(anonymous_namespace)::ForwardApply,_jhu::thrax::(anonymous_namespace)::BackwardApply,_jhu::thrax::(anonymous_namespace)::Concat,_jhu::thrax::(anonymous_namespace)::DoubleConcat>_>
  result;
  undefined1 local_f8 [8];
  undefined8 uStack_f0;
  undefined8 local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_e0;
  undefined8 uStack_d0;
  byte local_c8;
  pointer local_c0;
  uint local_b4;
  Tree *local_b0;
  _Storage<jhu::thrax::(anonymous_namespace)::Concat,_true> local_a8;
  size_t local_88;
  char *pcStack_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  size_t local_48;
  char *pcStack_40;
  ulong uVar27;
  
  nt_00 = nt.tgt;
  (this->key_).span = nt_00;
  __position._M_current =
       (this->cache_).
       super__Vector_base<jhu::thrax::CachedLabel,_std::allocator<jhu::thrax::CachedLabel>_>._M_impl
       .super__Vector_impl_data._M_start;
  pCVar4 = (this->cache_).
           super__Vector_base<jhu::thrax::CachedLabel,_std::allocator<jhu::thrax::CachedLabel>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uVar15 = (long)pCVar4 - (long)__position._M_current;
  if (0 < (long)uVar15) {
    sVar35 = (this->key_).span.start;
    uVar15 = (uVar15 >> 3) * -0x3333333333333333;
    do {
      uVar22 = uVar15 >> 1;
      pCVar1 = __position._M_current + uVar22;
      uVar31 = (undefined7)((ulong)in_R9 >> 8);
      in_R9 = (pointer)CONCAT71(uVar31,1);
      sVar2 = (pCVar1->span).start;
      if (sVar35 <= sVar2) {
        in_R9 = (pointer)CONCAT71(uVar31,(pCVar1->span).end < (this->key_).span.end &&
                                         sVar2 == sVar35);
      }
      if ((char)in_R9 != '\0') {
        __position._M_current = pCVar1 + 1;
        uVar22 = ~uVar22 + uVar15;
      }
      uVar15 = uVar22;
    } while (0 < (long)uVar22);
  }
  sVar35 = nt.tgt.start;
  if (((__position._M_current == pCVar4) || (sVar35 != ((__position._M_current)->span).start)) ||
     ((int)nt_00 >> 0x10 != (int)((__position._M_current)->span).end)) {
    local_b0 = &this->tree_;
    pNVar12 = (pointer)anon_unknown_0::constituent
                                 ((optional<jhu::thrax::(anonymous_namespace)::Constituent> *)
                                  &local_a8._M_value,local_b0,nt_00);
    if (local_a8._M_value.b._M_len._0_1_ == '\x01') {
      local_f8._0_4_ = local_a8._M_value.a._M_len._0_4_;
      local_f8._4_4_ = local_a8._M_value.a._M_len._4_4_;
      uStack_f0._4_4_ = local_a8._12_4_;
      uStack_f0._0_4_ = local_a8._8_4_;
      local_c8 = 0;
    }
    else {
      pNVar21 = (this->tree_).
                super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>._M_impl.
                super__Vector_impl_data._M_start;
      pNVar19 = (this->tree_).
                super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (pNVar21 != pNVar19) {
        pNVar16 = (pointer)((long)pNVar19 - (long)pNVar21 >> 5);
        pNVar18 = extraout_RDX;
        pNVar23 = pNVar21;
        pNVar24 = pNVar16;
        do {
          pNVar25 = pNVar21;
          pNVar29 = pNVar23;
          pNVar17 = pNVar23;
          if ((long)pNVar24 < 1) break;
          pNVar29 = (pointer)((ulong)pNVar24 >> 1);
          sVar2 = pNVar23[(long)pNVar29].span.start;
          if (sVar2 < sVar35) {
            in_R9 = (pointer)~(ulong)pNVar29;
            bVar6 = true;
            pNVar23 = pNVar23 + (long)((long)&(((_Optional_base<jhu::thrax::(anonymous_namespace)::Constituent,_true,_true>
                                                 *)&pNVar29->span)->_M_payload).
                                              super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Constituent>
                                              ._M_payload + 1);
            pNVar29 = (pointer)((long)&(((_Optional_base<jhu::thrax::(anonymous_namespace)::Constituent,_true,_true>
                                          *)&pNVar24->span)->_M_payload).
                                       super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Constituent>
                                       ._M_payload +
                               (long)&(((_Optional_base<jhu::thrax::(anonymous_namespace)::Constituent,_true,_true>
                                         *)&in_R9->span)->_M_payload).
                                      super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Constituent>
                                      ._M_payload);
          }
          else {
            bVar6 = true;
            in_R9 = pNVar29;
            if (sVar2 <= sVar35) {
              pNVar12 = pNVar23;
              pNVar18 = pNVar29;
              if (pNVar24 != (pointer)0x1) {
                do {
                  pNVar30 = (pointer)((ulong)pNVar18 >> 1);
                  pNVar17 = pNVar30;
                  if (pNVar12[(long)pNVar30].span.start < sVar35) {
                    pNVar17 = (pointer)((long)&(((_Optional_base<jhu::thrax::(anonymous_namespace)::Constituent,_true,_true>
                                                  *)&pNVar18->span)->_M_payload).
                                               super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Constituent>
                                               ._M_payload + ~(ulong)pNVar30);
                    pNVar12 = pNVar12 + (long)((long)&(((
                                                  _Optional_base<jhu::thrax::(anonymous_namespace)::Constituent,_true,_true>
                                                  *)&pNVar30->span)->_M_payload).
                                                  super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Constituent>
                                                  ._M_payload + 1);
                  }
                  pNVar18 = pNVar17;
                } while (0 < (long)pNVar17);
              }
              pNVar18 = pNVar23 + (long)((long)&(((
                                                  _Optional_base<jhu::thrax::(anonymous_namespace)::Constituent,_true,_true>
                                                  *)&pNVar29->span)->_M_payload).
                                                super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Constituent>
                                                ._M_payload + 1);
              pNVar29 = (pointer)((long)(pNVar23 + (long)pNVar24) - (long)pNVar18 >> 5);
              while (in_R9 = pNVar29, 0 < (long)in_R9) {
                pNVar29 = (pointer)((ulong)in_R9 >> 1);
                if (pNVar18[(long)pNVar29].span.start <= sVar35) {
                  pNVar18 = pNVar18 + (long)((long)&(((
                                                  _Optional_base<jhu::thrax::(anonymous_namespace)::Constituent,_true,_true>
                                                  *)&pNVar29->span)->_M_payload).
                                                  super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Constituent>
                                                  ._M_payload + 1);
                  pNVar29 = (pointer)((long)&(((_Optional_base<jhu::thrax::(anonymous_namespace)::Constituent,_true,_true>
                                                *)&in_R9->span)->_M_payload).
                                             super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Constituent>
                                             ._M_payload + ~(ulong)pNVar29);
                }
              }
              bVar6 = false;
              pNVar23 = pNVar23 + (long)pNVar24;
              pNVar29 = pNVar24;
            }
          }
          pNVar24 = pNVar29;
          pNVar29 = pNVar18;
          pNVar17 = pNVar12;
        } while (bVar6);
        do {
          pNVar12 = pNVar25;
          pNVar18 = pNVar25;
          if ((long)pNVar16 < 1) break;
          pNVar12 = (pointer)((ulong)pNVar16 >> 1);
          sVar2 = pNVar25[(long)pNVar12].span.start;
          sVar33 = nt.tgt.end;
          if (sVar2 < sVar33) {
            p_Var7 = (_Optional_base<jhu::thrax::(anonymous_namespace)::Constituent,_true,_true> *)
                     &pNVar12->span;
            bVar6 = true;
            pNVar12 = (pointer)((long)&(((_Optional_base<jhu::thrax::(anonymous_namespace)::Constituent,_true,_true>
                                          *)&pNVar16->span)->_M_payload).
                                       super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Constituent>
                                       ._M_payload + ~(ulong)pNVar12);
            pNVar25 = pNVar25 + (long)((long)&(p_Var7->_M_payload).
                                              super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Constituent>
                                              ._M_payload + 1);
          }
          else {
            bVar6 = true;
            if (sVar2 <= sVar33) {
              pNVar23 = pNVar25;
              pNVar18 = pNVar12;
              if (pNVar16 != (pointer)0x1) {
                do {
                  pNVar30 = (pointer)((ulong)pNVar18 >> 1);
                  pNVar24 = pNVar30;
                  if (pNVar23[(long)pNVar30].span.start < sVar33) {
                    pNVar24 = (pointer)((long)&(((_Optional_base<jhu::thrax::(anonymous_namespace)::Constituent,_true,_true>
                                                  *)&pNVar18->span)->_M_payload).
                                               super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Constituent>
                                               ._M_payload + ~(ulong)pNVar30);
                    pNVar23 = pNVar23 + (long)((long)&(((
                                                  _Optional_base<jhu::thrax::(anonymous_namespace)::Constituent,_true,_true>
                                                  *)&pNVar30->span)->_M_payload).
                                                  super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Constituent>
                                                  ._M_payload + 1);
                  }
                  pNVar18 = pNVar24;
                } while (0 < (long)pNVar24);
              }
              in_R9 = pNVar25 + (long)((long)&(((_Optional_base<jhu::thrax::(anonymous_namespace)::Constituent,_true,_true>
                                                 *)&pNVar12->span)->_M_payload).
                                              super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Constituent>
                                              ._M_payload + 1);
              uVar15 = (long)(pNVar25 + (long)pNVar16) - (long)in_R9 >> 5;
              while (uVar22 = uVar15, 0 < (long)uVar22) {
                uVar15 = uVar22 >> 1;
                if (in_R9[uVar15].span.start <= sVar33) {
                  in_R9 = in_R9 + uVar15 + 1;
                  uVar15 = ~uVar15 + uVar22;
                }
              }
              bVar6 = false;
              pNVar12 = pNVar16;
              pNVar25 = pNVar25 + (long)pNVar16;
            }
          }
          pNVar16 = pNVar12;
          pNVar12 = in_R9;
          pNVar18 = pNVar23;
        } while (bVar6);
        while (pNVar16 = pNVar29, pNVar23 = pNVar12, local_c0 = pNVar19, pNVar17 <= pNVar16 + -1) {
          while (pNVar24 = pNVar23, pNVar29 = pNVar16 + -1, pNVar18 <= pNVar24 + -1) {
            pNVar23 = pNVar24 + -1;
            if (pNVar16[-1].span.end == pNVar24[-1].span.end) {
              local_a8._M_value.a._M_len._0_4_ = (undefined4)pNVar16[-1].label._M_len;
              local_a8._M_value.a._M_len._4_4_ =
                   *(undefined4 *)((long)&pNVar16[-1].label._M_len + 4);
              ppcVar5 = &pNVar16[-1].label._M_str;
              local_a8._8_4_ = *(undefined4 *)ppcVar5;
              local_a8._12_4_ = *(undefined4 *)((long)&pNVar16[-1].label._M_str + 4);
              uStack_f0 = *ppcVar5;
              local_e8 = pNVar24[-1].label._M_len;
              aStack_e0._M_allocated_capacity = (size_type)pNVar24[-1].label._M_str;
              local_c8 = 1;
              local_a8._M_value.b._M_len = local_e8;
              local_a8._M_value.b._M_str = (char *)aStack_e0._M_allocated_capacity;
              local_f8._0_4_ = local_a8._M_value.a._M_len._0_4_;
              local_f8._4_4_ = local_a8._M_value.a._M_len._4_4_;
              goto LAB_00105052;
            }
          }
        }
        local_b4 = (int)nt_00 << 0x10;
        uVar32 = (uint)sVar35;
        unaff_R12 = (pointer)(ulong)uVar32;
        do {
          uVar3 = *(ushort *)
                   &(((_Optional_base<jhu::thrax::(anonymous_namespace)::Constituent,_true,_true> *)
                     &pNVar21->span)->_M_payload).
                    super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Constituent>.
                    _M_payload;
          iVar11 = 2;
          if (((int)(short)uVar3 < (int)uVar32) &&
             (iVar11 = 3,
             (int)nt_00 >> 0x10 ==
             (int)*(short *)((long)&(((_Optional_base<jhu::thrax::(anonymous_namespace)::Constituent,_true,_true>
                                       *)&pNVar21->span)->_M_payload).
                                    super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Constituent>
                                    ._M_payload + 2))) {
            local_f8._0_4_ = uVar3 | local_b4;
            uStack_f0 = (char *)0x0;
            local_e8 = 0;
            aStack_e0._M_allocated_capacity = 0;
            _Var13 = std::
                     __upper_bound<__gnu_cxx::__normal_iterator<jhu::thrax::Node_const*,std::vector<jhu::thrax::Node,std::allocator<jhu::thrax::Node>>>,jhu::thrax::Node,__gnu_cxx::__ops::_Val_comp_iter<jhu::thrax::label(std::vector<jhu::thrax::Node,std::allocator<jhu::thrax::Node>>const&,jhu::thrax::Span)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                               ((this->tree_).
                                super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (this->tree_).
                                super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>
                                ._M_impl.super__Vector_impl_data._M_finish,local_f8);
            pNVar19 = local_c0;
            if ((_Var13._M_current ==
                 (this->tree_).
                 super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>._M_impl.
                 super__Vector_impl_data._M_start) ||
               ((uVar3 != _Var13._M_current[-1].span.start ||
                (uVar32 != (int)_Var13._M_current[-1].span.end)))) {
              iVar11 = 0;
            }
            else {
              local_48 = _Var13._M_current[-1].label._M_len;
              pcStack_40 = _Var13._M_current[-1].label._M_str;
              local_58 = (undefined4)(pNVar21->label)._M_len;
              uStack_54 = *(undefined4 *)((long)&(pNVar21->label)._M_len + 4);
              uStack_50 = *(undefined4 *)&(pNVar21->label)._M_str;
              uStack_4c = *(undefined4 *)((long)&(pNVar21->label)._M_str + 4);
              iVar11 = 1;
            }
          }
          if ((iVar11 != 3) && (iVar11 != 0)) {
            if ((int)(short)uVar3 < (int)uVar32) {
              local_e8 = local_48;
              aStack_e0._M_allocated_capacity = (size_type)pcStack_40;
              local_f8._0_4_ = local_58;
              local_f8._4_4_ = uStack_54;
              uStack_f0._4_4_ = uStack_4c;
              uStack_f0._0_4_ = uStack_50;
              local_c8 = 2;
              goto LAB_00105052;
            }
            break;
          }
          pNVar21 = pNVar21 + 1;
        } while (pNVar21 != pNVar19);
      }
      anon_unknown_0::concatenation
                ((optional<jhu::thrax::(anonymous_namespace)::Concat> *)&local_a8._M_value,local_b0,
                 nt_00);
      if ((char)local_88 == '\0') {
        pNVar12 = (this->tree_).
                  super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar15 = (long)(this->tree_).
                       super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pNVar12 >> 5;
        do {
          pNVar19 = pNVar12;
          pNVar18 = pNVar12;
          if ((long)uVar15 < 1) break;
          uVar22 = uVar15 >> 1;
          sVar2 = pNVar12[uVar22].span.start;
          if (sVar2 < sVar35) {
            lVar8 = uVar22 + 1;
            bVar6 = true;
            uVar22 = uVar15 + ~uVar22;
            pNVar12 = pNVar12 + lVar8;
          }
          else {
            bVar6 = true;
            if (sVar2 <= sVar35) {
              uVar27 = uVar22;
              unaff_R12 = pNVar12;
              if (uVar15 != 1) {
                do {
                  uVar26 = uVar27 >> 1;
                  uVar28 = uVar26;
                  if (unaff_R12[uVar26].span.start < sVar35) {
                    uVar28 = ~uVar26 + uVar27;
                    unaff_R12 = unaff_R12 + uVar26 + 1;
                  }
                  uVar27 = uVar28;
                } while (0 < (long)uVar28);
              }
              pNVar21 = pNVar12 + uVar22 + 1;
              uVar22 = (long)(pNVar12 + uVar15) - (long)pNVar21 >> 5;
              while (uVar27 = uVar22, 0 < (long)uVar27) {
                uVar22 = uVar27 >> 1;
                if (pNVar21[uVar22].span.start <= sVar35) {
                  pNVar21 = pNVar21 + uVar22 + 1;
                  uVar22 = ~uVar22 + uVar27;
                }
              }
              bVar6 = false;
              uVar22 = uVar15;
              pNVar12 = pNVar12 + uVar15;
            }
          }
          uVar15 = uVar22;
          pNVar19 = pNVar21;
          pNVar18 = unaff_R12;
        } while (bVar6);
        if (pNVar18 < pNVar19) {
          do {
            anon_unknown_0::concatenation
                      ((optional<jhu::thrax::(anonymous_namespace)::Concat> *)local_f8,local_b0,
                       (Span)((uint)*(ushort *)
                                     ((long)&(((_Optional_base<jhu::thrax::(anonymous_namespace)::Constituent,_true,_true>
                                                *)&pNVar18->span)->_M_payload).
                                             super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Constituent>
                                             ._M_payload + 2) | (uint)nt_00 & 0xffff0000));
            uVar10 = aStack_e0._M_allocated_capacity;
            uVar9 = local_e8;
            if ((bool)aStack_e0._M_local_buf[8] == true) {
              local_a8._M_value.a._M_len._0_4_ = (undefined4)(pNVar18->label)._M_len;
              local_a8._M_value.a._M_len._4_4_ = *(undefined4 *)((long)&(pNVar18->label)._M_len + 4)
              ;
              ppcVar5 = &(pNVar18->label)._M_str;
              local_a8._8_4_ = *(undefined4 *)ppcVar5;
              local_a8._12_4_ = *(undefined4 *)((long)&(pNVar18->label)._M_str + 4);
              local_a8._M_value.b._M_len = (size_t)local_f8;
              local_a8._M_value.b._M_str = uStack_f0;
              local_88 = local_e8;
              pcStack_80 = (char *)aStack_e0._M_allocated_capacity;
              local_e8 = local_f8;
              aStack_e0._M_allocated_capacity = (size_type)uStack_f0;
              aStack_e0._8_8_ = uVar9;
              uStack_d0 = uVar10;
              local_c8 = 4;
              uStack_f0 = *ppcVar5;
              local_f8._0_4_ = local_a8._M_value.a._M_len._0_4_;
              local_f8._4_4_ = local_a8._M_value.a._M_len._4_4_;
              goto LAB_00105052;
            }
            pNVar18 = pNVar18 + 1;
          } while (pNVar18 < pNVar19);
        }
        local_f8._0_4_ = 1;
        local_f8._4_4_ = 0;
        uStack_f0 = "X";
        local_c8 = 0;
      }
      else {
        local_e8 = local_a8._M_value.b._M_len;
        aStack_e0._M_allocated_capacity = (size_type)local_a8._M_value.b._M_str;
        local_f8._0_4_ = local_a8._M_value.a._M_len._0_4_;
        local_f8._4_4_ = local_a8._M_value.a._M_len._4_4_;
        uStack_f0._4_4_ = local_a8._12_4_;
        uStack_f0._0_4_ = local_a8._8_4_;
        local_c8 = 3;
      }
    }
LAB_00105052:
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__deduce_visit_result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_jhu::thrax::(anonymous_namespace)::LabelVisitor_&&,_std::variant<jhu::thrax::(anonymous_namespace)::Constituent,_jhu::thrax::(anonymous_namespace)::ForwardApply,_jhu::thrax::(anonymous_namespace)::BackwardApply,_jhu::thrax::(anonymous_namespace)::Concat,_jhu::thrax::(anonymous_namespace)::DoubleConcat>_&&>
      ::_S_vtable._M_arr[local_c8]._M_data)
              (&local_78,(LabelVisitor *)&local_a8,
               (variant<jhu::thrax::(anonymous_namespace)::Constituent,_jhu::thrax::(anonymous_namespace)::ForwardApply,_jhu::thrax::(anonymous_namespace)::BackwardApply,_jhu::thrax::(anonymous_namespace)::Concat,_jhu::thrax::(anonymous_namespace)::DoubleConcat>
                *)local_f8);
    local_f8._0_2_ = nt_00.start;
    local_f8._2_2_ = nt_00.end;
    uStack_f0 = (char *)&aStack_e0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&uStack_f0,local_78._M_dataplus._M_p,
               local_78._M_dataplus._M_p + local_78._M_string_length);
    iVar14 = std::vector<jhu::thrax::CachedLabel,_std::allocator<jhu::thrax::CachedLabel>_>::
             _M_insert_rval(&this->cache_,__position,(value_type *)local_f8);
    pcVar20 = ((iVar14._M_current)->label)._M_dataplus._M_p;
    sVar34 = ((iVar14._M_current)->label)._M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)uStack_f0 != &aStack_e0) {
      operator_delete(uStack_f0,(ulong)(aStack_e0._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    pcVar20 = ((__position._M_current)->label)._M_dataplus._M_p;
    sVar34 = ((__position._M_current)->label)._M_string_length;
  }
  sVar36._M_str = pcVar20;
  sVar36._M_len = sVar34;
  return sVar36;
}

Assistant:

std::string_view SAMTLabeler::operator()(SpanPair nt) const {
  key_.span = nt.tgt;
  auto it = std::lower_bound(cache_.begin(), cache_.end(), key_, spanOrder);
  if (it != cache_.end() && it->span == nt.tgt) {
    return it->label;
  }
  auto result = std::visit(LabelVisitor{}, label(tree_, nt));
  return cache_.insert(it, CachedLabel{ nt.tgt, result })->label;
}